

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

int Internal_FakeWindowsLogfontName::CompareFamilyAndPostscriptNameHash
              (Internal_FakeWindowsLogfontName *lhs,Internal_FakeWindowsLogfontName *rhs)

{
  int iVar1;
  
  if (lhs == rhs) {
    return 0;
  }
  if (lhs == (Internal_FakeWindowsLogfontName *)0x0) {
    iVar1 = 1;
  }
  else {
    if (rhs != (Internal_FakeWindowsLogfontName *)0x0) {
      iVar1 = ON_SHA1_Hash::Compare
                        (&lhs->m_family_and_postcript_name_hash,
                         &rhs->m_family_and_postcript_name_hash);
      return iVar1;
    }
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int CompareFamilyAndPostscriptNameHash(
    const Internal_FakeWindowsLogfontName* lhs,
    const Internal_FakeWindowsLogfontName* rhs
    )
  {
    if (lhs == rhs)
      return 0;
    // nulls sort last
    if (nullptr == lhs)
      return 1;
    if (nullptr == rhs)
      return -1;
    return ON_SHA1_Hash::Compare(lhs->m_family_and_postcript_name_hash, rhs->m_family_and_postcript_name_hash);
  }